

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O0

iter_type __thiscall
booster::locale::util::base_num_format<char>::do_real_put<double>
          (base_num_format<char> *this,iter_type out,ios_base *ios,char_type fill,double val)

{
  long lVar1;
  iter_type out_00;
  iter_type out_01;
  iter_type out_02;
  fmtflags __fmtfl;
  uint64_t uVar2;
  streamsize sVar3;
  streambuf_type *psVar4;
  ios_base *in_RCX;
  undefined1 in_DL;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 in_RSI;
  long *in_RDI;
  char in_R8B;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  iter_type iVar5;
  iter_type iVar6;
  ios_base *unaff_retaddr;
  base_num_format<char> *in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  string_type *in_stack_00000040;
  bool intl;
  bool nat;
  sstream_type ss;
  ios_info *info;
  iter_type ret_ptr;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  bool bVar7;
  char_type fill_00;
  ios_base *in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd21;
  undefined8 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  char in_stack_fffffffffffffd50;
  string local_288 [32];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_208;
  undefined8 uStack_200;
  streambuf_type *local_1f8;
  undefined1 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  locale local_1c8;
  long local_1c0 [47];
  ios_info *local_48;
  double local_40;
  char local_31;
  ios_base *local_30;
  undefined8 local_20;
  undefined4 uStack_18;
  undefined4 uStack_14;
  time_t in_stack_fffffffffffffff0;
  undefined1 local_8;
  char_type in_stack_ffffffffffffffff;
  
  uStack_18 = CONCAT31(uStack_18._1_3_,in_DL);
  local_40 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_31 = in_R8B;
  local_30 = in_RCX;
  local_20 = in_RSI;
  local_48 = ios_info::get((ios_base *)0x28c406);
  uVar2 = ios_info::display_flags(local_48);
  fill_00 = (char_type)(uVar2 >> 0x38);
  switch(uVar2) {
  case 0:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::locale::classic();
    std::ios::imbue(&local_1c8);
    std::locale::~locale(&local_1c8);
    lVar1 = *(long *)(local_1c0[0] + -0x18);
    __fmtfl = std::ios_base::flags(local_30);
    std::ios_base::flags((ios_base *)((long)local_1c0 + lVar1),__fmtfl);
    lVar1 = *(long *)(local_1c0[0] + -0x18);
    sVar3 = std::ios_base::precision(local_30);
    std::ios_base::precision((ios_base *)((long)local_1c0 + lVar1),sVar3);
    lVar1 = *(long *)(local_1c0[0] + -0x18);
    sVar3 = std::ios_base::width(local_30);
    std::ios_base::width((ios_base *)((long)local_1c0 + lVar1),sVar3);
    uStack_1e0 = CONCAT44(uStack_14,uStack_18);
    local_1e8 = local_20;
    local_1f8 = (streambuf_type *)
                std::num_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::do_put
                          (local_40._0_4_,in_RDI,local_20,uStack_18,
                           (long)local_1c0 + *(long *)(local_1c0[0] + -0x18),(int)local_31);
    local_1f0 = extraout_DL;
    psVar4 = local_1f8;
    std::ios_base::width(local_30,0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    iVar5._8_8_ = extraout_RDX;
    iVar5._M_sbuf = psVar4;
    local_8 = extraout_DL;
    break;
  case 1:
  case 3:
  case 8:
  case 9:
  default:
    iVar5 = (iter_type)
            std::num_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::do_put
                      (SUB84(local_40,0),in_RDI,local_20,uStack_18,local_30,(int)local_31);
    local_8 = iVar5._M_failed;
    break;
  case 2:
    uVar2 = ios_info::currency_flags(local_48);
    bVar7 = true;
    if (uVar2 != 0) {
      uVar2 = ios_info::currency_flags(local_48);
      bVar7 = uVar2 == 0x40;
    }
    iVar5 = (iter_type)
            (**(code **)(*in_RDI + 0x50))
                      (in_RDI,~bVar7 & 1,local_20,uStack_18,local_30,(int)local_31,
                       (longdouble)local_40);
    local_8 = iVar5._M_failed;
    break;
  case 4:
    uStack_200 = CONCAT44(uStack_14,uStack_18);
    local_208 = local_20;
    out_00._8_4_ = in_stack_fffffffffffffd30;
    out_00._M_sbuf = (streambuf_type *)in_stack_fffffffffffffd28;
    out_00._12_4_ = in_stack_fffffffffffffd34;
    iVar5 = format_time((base_num_format<char> *)
                        CONCAT71(in_stack_fffffffffffffd21,in_stack_fffffffffffffd20),out_00,
                        in_stack_fffffffffffffd18,fill_00,(time_t)in_RDI,in_stack_fffffffffffffd50);
    local_8 = iVar5._M_failed;
    break;
  case 5:
    uStack_220 = CONCAT44(uStack_14,uStack_18);
    local_228 = local_20;
    out_01._8_4_ = in_stack_fffffffffffffd30;
    out_01._M_sbuf = (streambuf_type *)in_stack_fffffffffffffd28;
    out_01._12_4_ = in_stack_fffffffffffffd34;
    iVar5 = format_time((base_num_format<char> *)
                        CONCAT71(in_stack_fffffffffffffd21,in_stack_fffffffffffffd20),out_01,
                        in_stack_fffffffffffffd18,fill_00,(time_t)in_RDI,in_stack_fffffffffffffd50);
    local_8 = iVar5._M_failed;
    break;
  case 6:
    uStack_240 = CONCAT44(uStack_14,uStack_18);
    local_248 = local_20;
    out_02._8_4_ = in_stack_fffffffffffffd30;
    out_02._M_sbuf = (streambuf_type *)in_stack_fffffffffffffd28;
    out_02._12_4_ = in_stack_fffffffffffffd34;
    iVar5 = format_time((base_num_format<char> *)
                        CONCAT71(in_stack_fffffffffffffd21,in_stack_fffffffffffffd20),out_02,
                        in_stack_fffffffffffffd18,fill_00,(time_t)in_RDI,in_stack_fffffffffffffd50);
    local_8 = iVar5._M_failed;
    break;
  case 7:
    uStack_260 = CONCAT44(uStack_14,uStack_18);
    local_268 = local_20;
    ios_info::date_time_pattern<char>
              ((ios_info *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98));
    iVar5 = format_time(in_stack_00000008,(iter_type)in_stack_00000010,unaff_retaddr,
                        in_stack_ffffffffffffffff,in_stack_fffffffffffffff0,in_stack_00000040);
    psVar4 = iVar5._M_sbuf;
    local_8 = iVar5._M_failed;
    std::__cxx11::string::~string(local_288);
    iVar5._8_8_ = extraout_RDX_00;
    iVar5._M_sbuf = psVar4;
  }
  iVar6._9_7_ = iVar5._9_7_;
  iVar6._M_failed = (bool)local_8;
  iVar6._M_sbuf = iVar5._M_sbuf;
  return iVar6;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        typedef std::num_put<char_type> super;

        ios_info &info=ios_info::get(ios);

        switch(info.display_flags()) {
        case flags::posix:
            {
                typedef std::basic_ostringstream<char_type> sstream_type;
                sstream_type ss;
                ss.imbue(std::locale::classic());
                ss.flags(ios.flags());
                ss.precision(ios.precision());
                ss.width(ios.width());
                iter_type ret_ptr = super::do_put(out,ss,fill,val);
                ios.width(0);
                return ret_ptr;
            }
        case flags::date:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'x');
        case flags::time:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'X');
        case flags::datetime:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'c');
        case flags::strftime:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),info.date_time_pattern<char_type>());
        case flags::currency:
            {
                bool nat =  info.currency_flags()==flags::currency_default 
                            || info.currency_flags() == flags::currency_national;
                bool intl = !nat;
                return do_format_currency(intl,out,ios,fill,static_cast<long double>(val));
            }

        case flags::number:
        case flags::percent:
        case flags::spellout:
        case flags::ordinal:
        default:
            return super::do_put(out,ios,fill,val);
        }
    }